

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpsinput.cpp
# Opt level: O0

bool __thiscall soplex::MPSInput::readLine(MPSInput *this)

{
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  char *pcVar4;
  MPSInput *in_RDI;
  bool number;
  int i;
  bool is_comment;
  bool is_marker;
  char *s;
  int space;
  int len;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  bool local_69;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  bool local_29;
  int local_28;
  byte local_22;
  byte local_21;
  char *local_20;
  int local_18;
  int local_14;
  
  do {
    in_RDI->m_f5 = (char *)0x0;
    in_RDI->m_f4 = (char *)0x0;
    in_RDI->m_f3 = (char *)0x0;
    in_RDI->m_f2 = (char *)0x0;
    in_RDI->m_f1 = (char *)0x0;
    in_RDI->m_f0 = (char *)0x0;
    local_21 = 0;
    do {
      std::istream::getline((char *)in_RDI->m_input,(long)in_RDI->m_buf);
      uVar2 = std::ios::good();
      if (((uVar2 & 1) == 0) && (uVar2 = std::ios::eof(), (uVar2 & 1) == 0)) {
        return false;
      }
      in_RDI->m_lineno = in_RDI->m_lineno + 1;
      SPxOut::debug<soplex::MPSInput,_const_char_(&)[21],_int_&,_char_(&)[256],_0>
                (in_RDI,(char (*) [21])"DMPSIN01 Line {} {}\n",&in_RDI->m_lineno,&in_RDI->m_buf);
      local_22 = 1;
      if (in_RDI->m_buf[0] != '*') {
        sVar3 = strlen(in_RDI->m_buf);
        local_14 = (int)sVar3;
        for (local_28 = 0; local_28 < local_14; local_28 = local_28 + 1) {
          if (((in_RDI->m_buf[local_28] == '\t') || (in_RDI->m_buf[local_28] == '\n')) ||
             (in_RDI->m_buf[local_28] == '\r')) {
            in_RDI->m_buf[local_28] = ' ';
          }
          else if (in_RDI->m_buf[local_28] != ' ') {
            local_22 = 0;
          }
        }
      }
    } while ((local_22 & 1) != 0);
    sVar3 = strlen(in_RDI->m_buf);
    local_14 = (int)sVar3;
    if (local_14 < 0x50) {
      clear_from(in_RDI->m_buf,local_14);
    }
    if (in_RDI->m_buf[0] != ' ') {
      pcVar4 = strtok(in_RDI->m_buf," ");
      in_RDI->m_f0 = pcVar4;
      pcVar4 = strtok((char *)0x0," ");
      in_RDI->m_f1 = pcVar4;
      return true;
    }
    if ((in_RDI->m_is_new_format & 1U) == 0) {
      if ((in_RDI->m_buf[0xe] == '$') && (in_RDI->m_buf[0xd] == ' ')) {
        clear_from(in_RDI->m_buf,0xe);
      }
      else if ((in_RDI->m_buf[0x27] == '$') && (in_RDI->m_buf[0x26] == ' ')) {
        clear_from(in_RDI->m_buf,0x27);
      }
      local_18 = (int)(char)(in_RDI->m_buf[0xc] | in_RDI->m_buf[0xd] | in_RDI->m_buf[0x16] |
                             in_RDI->m_buf[0x17] | in_RDI->m_buf[0x24] | in_RDI->m_buf[0x25] |
                             in_RDI->m_buf[0x26] | in_RDI->m_buf[0x2f] | in_RDI->m_buf[0x30] |
                             in_RDI->m_buf[0x3d] | in_RDI->m_buf[0x3e] | in_RDI->m_buf[0x3f]);
      if ((local_18 == 0x20) || (local_14 < 0xd)) {
        iVar1 = isdigit((int)in_RDI->m_buf[0x18]);
        local_69 = true;
        if (iVar1 == 0) {
          iVar1 = isdigit((int)in_RDI->m_buf[0x19]);
          local_69 = true;
          if (iVar1 == 0) {
            iVar1 = isdigit((int)in_RDI->m_buf[0x1a]);
            local_69 = true;
            if (iVar1 == 0) {
              iVar1 = isdigit((int)in_RDI->m_buf[0x1b]);
              local_69 = true;
              if (iVar1 == 0) {
                iVar1 = isdigit((int)in_RDI->m_buf[0x1c]);
                local_69 = true;
                if (iVar1 == 0) {
                  iVar1 = isdigit((int)in_RDI->m_buf[0x1d]);
                  local_69 = true;
                  if (iVar1 == 0) {
                    iVar1 = isdigit((int)in_RDI->m_buf[0x1e]);
                    local_69 = true;
                    if (iVar1 == 0) {
                      iVar1 = isdigit((int)in_RDI->m_buf[0x1f]);
                      local_69 = true;
                      if (iVar1 == 0) {
                        iVar1 = isdigit((int)in_RDI->m_buf[0x20]);
                        local_69 = true;
                        if (iVar1 == 0) {
                          iVar1 = isdigit((int)in_RDI->m_buf[0x21]);
                          local_69 = true;
                          if (iVar1 == 0) {
                            iVar1 = isdigit((int)in_RDI->m_buf[0x22]);
                            local_69 = true;
                            if (iVar1 == 0) {
                              iVar1 = isdigit((int)in_RDI->m_buf[0x23]);
                              local_69 = iVar1 != 0;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        local_29 = local_69;
        if ((local_69 == false) && (0xc < local_14)) {
          if ((((in_RDI->m_section == COLUMNS) || (in_RDI->m_section == RHS)) ||
              (in_RDI->m_section == RANGES)) || (in_RDI->m_section == BOUNDS)) {
            in_RDI->m_is_new_format = true;
          }
        }
        else {
          patch_field(in_RDI->m_buf,4,0xc);
          patch_field(in_RDI->m_buf,0xe,0x16);
          patch_field(in_RDI->m_buf,0x27,0x2f);
        }
      }
      else {
        in_RDI->m_is_new_format = true;
      }
    }
    local_20 = in_RDI->m_buf + 1;
    pcVar4 = strtok(local_20," ");
    in_RDI->m_f1 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      pcVar4 = strtok((char *)0x0," ");
      in_RDI->m_f2 = pcVar4;
      if ((pcVar4 == (char *)0x0) || (*in_RDI->m_f2 == '$')) {
        in_RDI->m_f2 = (char *)0x0;
      }
      else {
        iVar1 = strcmp(in_RDI->m_f2,"\'MARKER\'");
        if (iVar1 == 0) {
          local_21 = 1;
        }
        pcVar4 = strtok((char *)0x0," ");
        in_RDI->m_f3 = pcVar4;
        if ((pcVar4 == (char *)0x0) || (*in_RDI->m_f3 == '$')) {
          in_RDI->m_f3 = (char *)0x0;
        }
        else {
          if ((local_21 & 1) != 0) {
            iVar1 = strcmp(in_RDI->m_f3,"\'INTORG\'");
            if (iVar1 == 0) {
              in_RDI->m_is_integer = true;
            }
            else {
              iVar1 = strcmp(in_RDI->m_f3,"\'INTEND\'");
              if (iVar1 != 0) goto LAB_007ddadc;
              in_RDI->m_is_integer = false;
            }
          }
          iVar1 = strcmp(in_RDI->m_f3,"\'MARKER\'");
          if (iVar1 == 0) {
            local_21 = 1;
          }
          pcVar4 = strtok((char *)0x0," ");
          in_RDI->m_f4 = pcVar4;
          if ((pcVar4 == (char *)0x0) || (*in_RDI->m_f4 == '$')) {
            in_RDI->m_f4 = (char *)0x0;
          }
          else {
            if ((local_21 & 1) != 0) {
              iVar1 = strcmp(in_RDI->m_f4,"\'INTORG\'");
              if (iVar1 == 0) {
                in_RDI->m_is_integer = true;
              }
              else {
                iVar1 = strcmp(in_RDI->m_f4,"\'INTEND\'");
                if (iVar1 != 0) goto LAB_007ddadc;
                in_RDI->m_is_integer = false;
              }
            }
            pcVar4 = strtok((char *)0x0," ");
            in_RDI->m_f5 = pcVar4;
            if ((pcVar4 == (char *)0x0) || (*in_RDI->m_f5 == '$')) {
              in_RDI->m_f5 = (char *)0x0;
            }
          }
        }
      }
    }
LAB_007ddadc:
    if ((local_21 & 1) == 0) {
      if (in_RDI->m_f0 == (char *)0x0) {
        local_78 = "nil";
      }
      else {
        local_78 = in_RDI->m_f0;
      }
      local_38 = local_78;
      if (in_RDI->m_f1 == (char *)0x0) {
        local_80 = "nil";
      }
      else {
        local_80 = in_RDI->m_f1;
      }
      local_40 = local_80;
      if (in_RDI->m_f2 == (char *)0x0) {
        local_88 = "nil";
      }
      else {
        local_88 = in_RDI->m_f2;
      }
      local_48 = local_88;
      if (in_RDI->m_f3 == (char *)0x0) {
        local_90 = "nil";
      }
      else {
        local_90 = in_RDI->m_f3;
      }
      local_50 = local_90;
      if (in_RDI->m_f4 == (char *)0x0) {
        local_98 = "nil";
      }
      else {
        local_98 = in_RDI->m_f4;
      }
      local_58 = local_98;
      if (in_RDI->m_f5 == (char *)0x0) {
        local_a0 = "nil";
      }
      else {
        local_a0 = in_RDI->m_f5;
      }
      local_60 = local_a0;
      SPxOut::
      debug<soplex::MPSInput,_const_char_(&)[205],_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_const_char_*,_0>
                (in_RDI,(char (*) [205])
                        "DMPSIN02 -----------------------------------------------\nDMPSIN03 f0={}\nDMPSIN04 f1={}\nDMPSIN05 f2={}\nDMPSIN07 f4={}\nDMPSIN06 f3={}\nDMPSIN08 f5={}\nDMPSIN09 -----------------------------------------------\n"
                 ,&local_38,&local_40,&local_48,&local_50,&local_58,&local_60);
      return true;
    }
  } while( true );
}

Assistant:

bool MPSInput::readLine()
{
   int   len;
   int   space;
   char* s;
   bool  is_marker;
   bool  is_comment;

   do
   {
      m_f0 = m_f1 = m_f2 = m_f3 = m_f4 = m_f5 = nullptr;
      is_marker = false;

      // Read until we have a non-empty, non-comment line.
      do
      {
         if(!m_input.getline(m_buf, sizeof(m_buf)).good() && !m_input.eof())
            return false;

         m_lineno++;

         SPxOut::debug(this, "DMPSIN01 Line {} {}\n", m_lineno, m_buf);

         /* check if comment line */
         is_comment = true;

         if(m_buf[0] == '*')
            continue;

         /* normalize line and check if it is empty */
         len = int(strlen(m_buf));

         for(int i = 0; i < len; i++)
         {
            if(m_buf[i] == '\t' || m_buf[i] == '\n' || m_buf[i] == '\r')
               m_buf[i] = BLANK;
            else if(m_buf[i] != BLANK)
               is_comment = false;
         }
      }
      while(is_comment);

      len = int(strlen(m_buf));

      if(len < 80)
         clear_from(m_buf, len);

      assert(strlen(m_buf) >= 80);

      /* Look for new section
       */
      if(*m_buf != BLANK)
      {
         m_f0 = strtok(&m_buf[0], " ");

         assert(m_f0 != nullptr);

         m_f1 = strtok(nullptr, " ");

         return true;
      }

      if(!m_is_new_format)
      {
         /* Test for fixed format comments
          */
         if((m_buf[14] == '$') && (m_buf[13] == ' '))
            clear_from(m_buf, 14);
         else if((m_buf[39] == '$') && (m_buf[38] == ' '))
            clear_from(m_buf, 39);

         /* Test for fixed format
          */
         space = m_buf[12] | m_buf[13]
                 | m_buf[22] | m_buf[23]
                 | m_buf[36] | m_buf[37] | m_buf[38]
                 | m_buf[47] | m_buf[48]
                 | m_buf[61] | m_buf[62] | m_buf[63];

         if(space == BLANK || len < 13)
         {
            /* Now we have space at the right positions.
             * But are there also the non space where they
             * should be ?
             */
            bool number = isdigit(m_buf[24]) || isdigit(m_buf[25])
                          || isdigit(m_buf[26]) || isdigit(m_buf[27])
                          || isdigit(m_buf[28]) || isdigit(m_buf[29])
                          || isdigit(m_buf[30]) || isdigit(m_buf[31])
                          || isdigit(m_buf[32]) || isdigit(m_buf[33])
                          || isdigit(m_buf[34]) || isdigit(m_buf[35]);

            /* len < 13 is handle ROW lines with embedded spaces
             * in the names correctly
             */
            if(number || len < 13)
            {
               /* Now we assume fixed format, so we patch possible embedded spaces.
                */
               patch_field(m_buf,  4, 12);
               patch_field(m_buf, 14, 22);
               patch_field(m_buf, 39, 47);
            }
            else
            {
               if(m_section == COLUMNS || m_section == RHS
                     || m_section == RANGES  || m_section == BOUNDS)
                  m_is_new_format = true;
            }
         }
         else
         {
            m_is_new_format = true;
         }
      }

      s = &m_buf[1];

      /* At this point it is not clear if we have a indicator field.
       * If there is none (e.g. empty) f1 will be the first name field.
       * If there is one, f2 will be the first name field.
       *
       * Initially comment marks '$' ar only allowed in the beginning
       * of the 2nd and 3rd name field. We test all fields but the first.
       * This makes no difference, since if the $ is at the start of a value
       * field, the line will be errornous anyway.
       */
      do
      {
         if(nullptr == (m_f1 = strtok(s, " ")))
            break;

         if((nullptr == (m_f2 = strtok(nullptr, " "))) || (*m_f2 == '$'))
         {
            m_f2 = nullptr;
            break;
         }

         if(!strcmp(m_f2, "'MARKER'"))
            is_marker = true;

         if((nullptr == (m_f3 = strtok(nullptr, " "))) || (*m_f3 == '$'))
         {
            m_f3 = nullptr;
            break;
         }

         if(is_marker)
         {
            if(!strcmp(m_f3, "'INTORG'"))
               m_is_integer = true;
            else if(!strcmp(m_f3, "'INTEND'"))
               m_is_integer = false;
            else
               break; // unknown marker
         }

         if(!strcmp(m_f3, "'MARKER'"))
            is_marker = true;

         if((nullptr == (m_f4 = strtok(nullptr, " "))) || (*m_f4 == '$'))
         {
            m_f4 = nullptr;
            break;
         }

         if(is_marker)
         {
            if(!strcmp(m_f4, "'INTORG'"))
               m_is_integer = true;
            else if(!strcmp(m_f4, "'INTEND'"))
               m_is_integer = false;
            else
               break; // unknown marker
         }

         if((nullptr == (m_f5 = strtok(nullptr, " "))) || (*m_f5 == '$'))
            m_f5 = nullptr;
      }
      while(false);
   }
   while(is_marker);

   SPxOut::debug(this, "DMPSIN02 -----------------------------------------------\n"
                 "DMPSIN03 f0={}\n"
                 "DMPSIN04 f1={}\n"
                 "DMPSIN05 f2={}\n"
                 "DMPSIN07 f4={}\n"
                 "DMPSIN06 f3={}\n"
                 "DMPSIN08 f5={}\n"
                 "DMPSIN09 -----------------------------------------------\n",
                 ((m_f0 == nullptr) ? "nil" : m_f0),
                 ((m_f1 == nullptr) ? "nil" : m_f1),
                 ((m_f2 == nullptr) ? "nil" : m_f2),
                 ((m_f3 == nullptr) ? "nil" : m_f3),
                 ((m_f4 == nullptr) ? "nil" : m_f4),
                 ((m_f5 == nullptr) ? "nil" : m_f5));
   return true;
}